

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall el::base::VRegistry::setModules(VRegistry *this,char *modules)

{
  char cVar1;
  long lVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  bool bVar6;
  allocator local_1ea;
  anon_class_1_0_00000001 addSuffix;
  anon_class_16_2_658133bf insert;
  string local_1d8 [8];
  long local_1d0;
  stringstream ss;
  ostream local_1a8 [8];
  string local_1a0 [368];
  
  (*(this->super_ThreadSafe)._vptr_ThreadSafe[2])();
  insert.addSuffix = &addSuffix;
  insert.this = this;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  uVar5 = 0xffffffff;
  bVar4 = true;
  bVar6 = false;
  do {
    cVar1 = *modules;
    if (cVar1 == '\0') {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::~string(local_1d8);
      if ((local_1d0 != 0) && (uVar5 != 0xffffffff)) {
        setModules::anon_class_16_2_658133bf::operator()(&insert,&ss,(VerboseLevel)uVar5);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      return;
    }
    if (cVar1 == '=') {
      bVar6 = true;
LAB_00116543:
      bVar4 = false;
    }
    else if (cVar1 == ',') {
      std::__cxx11::stringbuf::str();
      lVar2 = local_1d0;
      std::__cxx11::string::~string(local_1d8);
      bVar6 = false;
      bVar4 = true;
      if ((lVar2 != 0) && (uVar5 != 0xffffffff)) {
        setModules::anon_class_16_2_658133bf::operator()(&insert,&ss,(VerboseLevel)uVar5);
        std::__cxx11::string::string(local_1d8,"",&local_1ea);
        std::__cxx11::stringbuf::str(local_1a0);
        std::__cxx11::string::~string(local_1d8);
        bVar6 = false;
        uVar5 = 0xffffffff;
      }
    }
    else {
      if (!bVar4) {
        uVar3 = (int)cVar1 - 0x30U;
        if (9 < (int)cVar1 - 0x30U) {
          uVar3 = uVar5;
        }
        if (bVar6) {
          uVar5 = uVar3;
        }
        goto LAB_00116543;
      }
      bVar4 = true;
      std::operator<<(local_1a8,cVar1);
    }
    modules = modules + 1;
  } while( true );
}

Assistant:

void VRegistry::setModules(const char* modules) {
  base::threading::ScopedLock scopedLock(lock());
  auto addSuffix = [](std::stringstream& ss, const char* sfx, const char* prev) {
    if (prev != nullptr && base::utils::Str::endsWith(ss.str(), std::string(prev))) {
      std::string chr(ss.str().substr(0, ss.str().size() - strlen(prev)));
      ss.str(std::string(""));
      ss << chr;
    }
    if (base::utils::Str::endsWith(ss.str(), std::string(sfx))) {
      std::string chr(ss.str().substr(0, ss.str().size() - strlen(sfx)));
      ss.str(std::string(""));
      ss << chr;
    }
    ss << sfx;
  };
  auto insert = [&](std::stringstream& ss, base::type::VerboseLevel level) {
    if (!base::utils::hasFlag(LoggingFlag::DisableVModulesExtensions, *m_pFlags)) {
      addSuffix(ss, ".h", nullptr);
      m_modules.insert(std::make_pair(ss.str(), level));
      addSuffix(ss, ".c", ".h");
      m_modules.insert(std::make_pair(ss.str(), level));
      addSuffix(ss, ".cpp", ".c");
      m_modules.insert(std::make_pair(ss.str(), level));
      addSuffix(ss, ".cc", ".cpp");
      m_modules.insert(std::make_pair(ss.str(), level));
      addSuffix(ss, ".cxx", ".cc");
      m_modules.insert(std::make_pair(ss.str(), level));
      addSuffix(ss, ".-inl.h", ".cxx");
      m_modules.insert(std::make_pair(ss.str(), level));
      addSuffix(ss, ".hxx", ".-inl.h");
      m_modules.insert(std::make_pair(ss.str(), level));
      addSuffix(ss, ".hpp", ".hxx");
      m_modules.insert(std::make_pair(ss.str(), level));
      addSuffix(ss, ".hh", ".hpp");
    }
    m_modules.insert(std::make_pair(ss.str(), level));
  };
  bool isMod = true;
  bool isLevel = false;
  std::stringstream ss;
  int level = -1;
  for (; *modules; ++modules) {
    switch (*modules) {
    case '=':
      isLevel = true;
      isMod = false;
      break;
    case ',':
      isLevel = false;
      isMod = true;
      if (!ss.str().empty() && level != -1) {
        insert(ss, static_cast<base::type::VerboseLevel>(level));
        ss.str(std::string(""));
        level = -1;
      }
      break;
    default:
      if (isMod) {
        ss << *modules;
      } else if (isLevel) {
        if (isdigit(*modules)) {
          level = static_cast<base::type::VerboseLevel>(*modules) - 48;
        }
      }
      break;
    }
  }
  if (!ss.str().empty() && level != -1) {
    insert(ss, static_cast<base::type::VerboseLevel>(level));
  }
}